

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O2

unsigned_long_long ncr(int n,int k)

{
  ulong uVar1;
  unsigned_long_long uVar2;
  long lVar3;
  unsigned_long_long uVar4;
  
  if (n < k) {
    uVar2 = 0;
  }
  else {
    lVar3 = (long)n;
    uVar2 = 1;
    for (uVar4 = uVar2; uVar4 <= (ulong)(long)k; uVar4 = uVar4 + 1) {
      uVar1 = uVar2 * lVar3;
      lVar3 = lVar3 + -1;
      uVar2 = uVar1 / uVar4;
    }
  }
  return uVar2;
}

Assistant:

unsigned long long
ncr(int n, int k) {
    if (k > n) {
        return 0;
    }
    unsigned long long r = 1;
    for (unsigned long long d = 1; d <= k; ++d) {
        r *= n--;
        r /= d;
    }
    return r;
}